

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall UnitTestBasehello11::Run(UnitTestBasehello11 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  UnitTestBase *pUVar3;
  Regex t;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Regex local_48;
  
  bert::Regex::Regex(&local_48,"[^abc]*");
  bVar2 = bert::Regex::Match(&local_48,"xyz");
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\'t.Match(\"xyz\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_88,true,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\'t.Match(\"xyz\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_88,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_48,"a");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\'!(t.Match(\"a\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_a8,false,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\'!(t.Match(\"a\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_a8,true,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_48,"b");
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\'!(t.Match(\"b\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_68,false,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\'!(t.Match(\"b\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_68,true,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_48,"abc");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"\'!(t.Match(\"abc\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_c8,false,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"\'!(t.Match(\"abc\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_c8,true,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_48,"fuckabc");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"\'!(t.Match(\"fuckabc\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_e8,false,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"\'!(t.Match(\"fuckabc\"))\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_e8,true,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  bert::Regex::~Regex(&local_48);
  return;
}

Assistant:

TEST_CASE(hello11)
{
    Regex t("[^abc]*");
    EXPECT_TRUE(t.Match("xyz"));
    EXPECT_FALSE(t.Match("a"));
    EXPECT_FALSE(t.Match("b"));
    EXPECT_FALSE(t.Match("abc"));
    EXPECT_FALSE(t.Match("fuckabc"));
}